

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O3

NeuralNetwork *
addInnerProductLayer
          (Model *m,bool isUpdatable,char *name,TensorAttributes *inTensorAttr,
          TensorAttributes *outTensorAttr,bool areWeightsQuantized,bool isBiasQuantized)

{
  RepeatedField<float> *pRVar1;
  int iVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  NeuralNetwork *pNVar6;
  NeuralNetworkLayer *pNVar7;
  LayerUnion LVar8;
  WeightParams *pWVar9;
  QuantizationParams *pQVar10;
  float *pfVar11;
  LinearQuantizationParams *pLVar12;
  undefined8 *puVar13;
  Arena *pAVar14;
  
  if (m->_oneof_case_[0] == 500) {
    pNVar6 = (NeuralNetwork *)(m->Type_).pipeline_;
  }
  else {
    CoreML::Specification::Model::clear_Type(m);
    m->_oneof_case_[0] = 500;
    uVar5 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar14 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar14 = *(Arena **)pAVar14;
    }
    pNVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>
                       (pAVar14);
    (m->Type_).neuralnetwork_ = pNVar6;
  }
  pRVar4 = (pNVar6->layers_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    iVar2 = (pNVar6->layers_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar2 < pRVar4->allocated_size) {
      (pNVar6->layers_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
      pNVar7 = (NeuralNetworkLayer *)pRVar4->elements[iVar2];
      goto LAB_001ddc97;
    }
  }
  pNVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                     ((pNVar6->layers_).super_RepeatedPtrFieldBase.arena_);
  pNVar7 = (NeuralNetworkLayer *)
           google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                     (&(pNVar6->layers_).super_RepeatedPtrFieldBase,pNVar7);
LAB_001ddc97:
  uVar5 = (pNVar7->super_MessageLite)._internal_metadata_.ptr_;
  puVar13 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
  if ((uVar5 & 1) != 0) {
    puVar13 = (undefined8 *)*puVar13;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar7->name_,name,puVar13);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar7,inTensorAttr->name);
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar7,outTensorAttr->name);
  if (pNVar7->_oneof_case_[0] == 0x8c) {
    LVar8 = pNVar7->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar7);
    pNVar7->_oneof_case_[0] = 0x8c;
    uVar5 = (pNVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar14 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar14 = *(Arena **)pAVar14;
    }
    LVar8.innerproduct_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::InnerProductLayerParams>
                   (pAVar14);
    (pNVar7->layer_).innerproduct_ = (InnerProductLayerParams *)LVar8;
  }
  (LVar8.innerproduct_)->inputchannels_ = 1;
  (LVar8.innerproduct_)->outputchannels_ = 1;
  pWVar9 = (WeightParams *)((LVar8.activation_)->NonlinearityType_).relu_;
  if (pWVar9 == (WeightParams *)0x0) {
    uVar5 = ((LVar8.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar14 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar14 = *(Arena **)pAVar14;
    }
    pWVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                       (pAVar14);
    ((LVar8.activation_)->NonlinearityType_).relu_ = (ActivationReLU *)pWVar9;
  }
  if (areWeightsQuantized) {
    pQVar10 = pWVar9->quantization_;
    if (pQVar10 == (QuantizationParams *)0x0) {
      uVar5 = (pWVar9->super_MessageLite)._internal_metadata_.ptr_;
      pAVar14 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar14 = *(Arena **)pAVar14;
      }
      pQVar10 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::QuantizationParams>(pAVar14);
      pWVar9->quantization_ = pQVar10;
    }
    pQVar10->numberofbits_ = 1;
    if (pQVar10->_oneof_case_[0] == 0x65) {
      pLVar12 = (pQVar10->QuantizationType_).linearquantization_;
    }
    else {
      CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar10);
      pQVar10->_oneof_case_[0] = 0x65;
      uVar5 = (pQVar10->super_MessageLite)._internal_metadata_.ptr_;
      pAVar14 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar14 = *(Arena **)pAVar14;
      }
      pLVar12 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::LinearQuantizationParams>(pAVar14);
      (pQVar10->QuantizationType_).linearquantization_ = pLVar12;
    }
    pRVar1 = &pLVar12->scale_;
    uVar3 = (pLVar12->scale_).current_size_;
    if (uVar3 == (pLVar12->scale_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,uVar3 + 1);
      pfVar11 = google::protobuf::RepeatedField<float>::elements(pRVar1);
      pfVar11[uVar3] = 1.0;
    }
    else {
      pfVar11 = google::protobuf::RepeatedField<float>::elements(pRVar1);
      pfVar11[uVar3] = 1.0;
    }
    (pLVar12->scale_).current_size_ = uVar3 + 1;
    pRVar1 = &pLVar12->bias_;
    uVar3 = (pLVar12->bias_).current_size_;
    if (uVar3 == (pLVar12->bias_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,uVar3 + 1);
      pfVar11 = google::protobuf::RepeatedField<float>::elements(pRVar1);
      pfVar11[uVar3] = 0.0;
    }
    else {
      pfVar11 = google::protobuf::RepeatedField<float>::elements(pRVar1);
      pfVar11[uVar3] = 0.0;
    }
    pRVar1->current_size_ = uVar3 + 1;
    uVar5 = (pWVar9->super_MessageLite)._internal_metadata_.ptr_;
    puVar13 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      puVar13 = (undefined8 *)*puVar13;
    }
    google::protobuf::internal::ArenaStringPtr::
    Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
              (&pWVar9->int8rawvalue_,"x01",puVar13);
  }
  else {
    pRVar1 = &pWVar9->floatvalue_;
    uVar3 = (pWVar9->floatvalue_).current_size_;
    if (uVar3 == (pWVar9->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,uVar3 + 1);
      pfVar11 = google::protobuf::RepeatedField<float>::elements(pRVar1);
      pfVar11[uVar3] = 1.0;
    }
    else {
      pfVar11 = google::protobuf::RepeatedField<float>::elements(pRVar1);
      pfVar11[uVar3] = 1.0;
    }
    pRVar1->current_size_ = uVar3 + 1;
  }
  (LVar8.innerproduct_)->hasbias_ = true;
  pWVar9 = (LVar8.innerproduct_)->bias_;
  if (pWVar9 == (WeightParams *)0x0) {
    uVar5 = ((LVar8.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
    pAVar14 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar14 = *(Arena **)pAVar14;
    }
    pWVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                       (pAVar14);
    (LVar8.innerproduct_)->bias_ = pWVar9;
  }
  if (isBiasQuantized) {
    pQVar10 = pWVar9->quantization_;
    if (pQVar10 == (QuantizationParams *)0x0) {
      uVar5 = (pWVar9->super_MessageLite)._internal_metadata_.ptr_;
      pAVar14 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar14 = *(Arena **)pAVar14;
      }
      pQVar10 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::QuantizationParams>(pAVar14);
      pWVar9->quantization_ = pQVar10;
    }
    pQVar10->numberofbits_ = 1;
    if (pQVar10->_oneof_case_[0] == 0x65) {
      pLVar12 = (pQVar10->QuantizationType_).linearquantization_;
    }
    else {
      CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar10);
      pQVar10->_oneof_case_[0] = 0x65;
      uVar5 = (pQVar10->super_MessageLite)._internal_metadata_.ptr_;
      pAVar14 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar14 = *(Arena **)pAVar14;
      }
      pLVar12 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::LinearQuantizationParams>(pAVar14);
      (pQVar10->QuantizationType_).linearquantization_ = pLVar12;
    }
    pRVar1 = &pLVar12->scale_;
    uVar3 = (pLVar12->scale_).current_size_;
    if (uVar3 == (pLVar12->scale_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,uVar3 + 1);
      pfVar11 = google::protobuf::RepeatedField<float>::elements(pRVar1);
      pfVar11[uVar3] = 1.0;
    }
    else {
      pfVar11 = google::protobuf::RepeatedField<float>::elements(pRVar1);
      pfVar11[uVar3] = 1.0;
    }
    (pLVar12->scale_).current_size_ = uVar3 + 1;
    pRVar1 = &pLVar12->bias_;
    uVar3 = (pLVar12->bias_).current_size_;
    if (uVar3 == (pLVar12->bias_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,uVar3 + 1);
      pfVar11 = google::protobuf::RepeatedField<float>::elements(pRVar1);
      pfVar11[uVar3] = 0.0;
    }
    else {
      pfVar11 = google::protobuf::RepeatedField<float>::elements(pRVar1);
      pfVar11[uVar3] = 0.0;
    }
    pRVar1->current_size_ = uVar3 + 1;
    uVar5 = (pWVar9->super_MessageLite)._internal_metadata_.ptr_;
    puVar13 = (undefined8 *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      puVar13 = (undefined8 *)*puVar13;
    }
    google::protobuf::internal::ArenaStringPtr::
    Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
              (&pWVar9->int8rawvalue_,"x01",puVar13);
  }
  else {
    pRVar1 = &pWVar9->floatvalue_;
    uVar3 = (pWVar9->floatvalue_).current_size_;
    if (uVar3 == (pWVar9->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,uVar3 + 1);
      pfVar11 = google::protobuf::RepeatedField<float>::elements(pRVar1);
      pfVar11[uVar3] = 1.0;
    }
    else {
      pfVar11 = google::protobuf::RepeatedField<float>::elements(pRVar1);
      pfVar11[uVar3] = 1.0;
    }
    pRVar1->current_size_ = uVar3 + 1;
  }
  if (isUpdatable) {
    pNVar7->isupdatable_ = true;
    pWVar9 = (WeightParams *)((LVar8.activation_)->NonlinearityType_).linear_;
    if (pWVar9 == (WeightParams *)0x0) {
      uVar5 = ((LVar8.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
      pAVar14 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar14 = *(Arena **)pAVar14;
      }
      pWVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar14);
      ((LVar8.activation_)->NonlinearityType_).linear_ = (ActivationLinear *)pWVar9;
    }
    pWVar9->isupdatable_ = true;
    pWVar9 = (LVar8.innerproduct_)->bias_;
    if (pWVar9 == (WeightParams *)0x0) {
      uVar5 = ((LVar8.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
      pAVar14 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar14 = *(Arena **)pAVar14;
      }
      pWVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                         (pAVar14);
      (LVar8.innerproduct_)->bias_ = pWVar9;
    }
    pWVar9->isupdatable_ = true;
  }
  return pNVar6;
}

Assistant:

Specification::NeuralNetwork* addInnerProductLayer(Specification::Model& m, bool isUpdatable, const char *name, const TensorAttributes *inTensorAttr, const TensorAttributes *outTensorAttr, bool areWeightsQuantized, bool isBiasQuantized) {
    
    auto neuralNet = m.mutable_neuralnetwork();
    auto layer = neuralNet->add_layers();
    
    layer->set_name(name);
    layer->add_input(inTensorAttr->name);
    layer->add_output(outTensorAttr->name);
    Specification::InnerProductLayerParams *innerProductParams = layer->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);

    // set weight
    auto* weights = innerProductParams->mutable_weights();
    if (areWeightsQuantized) {
        auto *quant_params = weights->mutable_quantization();
        quant_params->set_numberofbits(1);
        auto *linear_quant_params = quant_params->mutable_linearquantization();
        linear_quant_params->add_scale(1.0f);
        linear_quant_params->add_bias(0.0f);
        weights->set_int8rawvalue("x01"); // this is [1]
    } else {
        weights->add_floatvalue(1.0);
    }

    // set bias
    innerProductParams->set_hasbias(true);
    auto* bias = innerProductParams->mutable_bias();
    if (isBiasQuantized) {
        auto *quant_params = bias->mutable_quantization();
        quant_params->set_numberofbits(1);
        auto *linear_quant_params = quant_params->mutable_linearquantization();
        linear_quant_params->add_scale(1.0f);
        linear_quant_params->add_bias(0.0f);
        bias->set_int8rawvalue("x01"); // this is [1]
    } else {
        bias->add_floatvalue(1.0);
    }
    
    if (isUpdatable) {
        layer->set_isupdatable(true);
        innerProductParams->mutable_weights()->set_isupdatable(true);
        innerProductParams->mutable_bias()->set_isupdatable(true);
    }

    return neuralNet;
}